

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_01.hpp
# Opt level: O2

result_type __thiscall
boost::random::detail::new_uniform_01<double>::operator()
          (new_uniform_01<double> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *eng)

{
  undefined1 auVar1 [16];
  double dVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 in_XMM3 [16];
  
  uVar4 = (ulong)eng->_x;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4 * 0xbc8f;
    uVar4 = SUB168(auVar1 % ZEXT816(0x7fffffff),0);
    uVar3 = SUB164(auVar1 % ZEXT816(0x7fffffff),0);
    auVar1 = vcvtusi2sd_avx512f(in_XMM3,uVar3 - 1);
    dVar2 = auVar1._0_8_ * 4.656612877414201e-10;
  } while (1.0 <= dVar2);
  eng->_x = uVar3;
  return dVar2;
}

Assistant:

result_type operator()(Engine& eng) {
    for (;;) {
      typedef typename Engine::result_type base_result;
      result_type factor = result_type(1) /
              (result_type((eng.max)()-(eng.min)()) +
               result_type(std::numeric_limits<base_result>::is_integer ? 1 : 0));
      result_type result = result_type(eng() - (eng.min)()) * factor;
      if (result < result_type(1))
        return result;
    }
  }